

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

int __thiscall
CVmObjFileName::getp_isAbsolute(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int iVar2;
  vm_filnam_ext *this_00;
  int *in_RCX;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  uint argc;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int n;
  
  if (in_RCX == (int *)0x0) {
    n = 0;
  }
  else {
    n = *in_RCX;
  }
  iVar2 = n;
  if ((getp_isAbsolute(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_isAbsolute(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_isAbsolute::desc,0);
    __cxa_guard_release(&getp_isAbsolute(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc
                    (in_RDI,(uint *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
  if (iVar2 == 0) {
    this_00 = get_ext((CVmObjFileName *)in_RDI);
    vm_filnam_ext::get_str(this_00);
    iVar2 = fn_is_file_absolute((char *)in_RDX);
    vm_val_t::set_logical(in_RDX,iVar2);
    CVmStack::discard(n);
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_isAbsolute(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* ask the OS if we're absolute, and set the return value accordingly */
    retval->set_logical(fn_is_file_absolute(vmg_ get_ext()->get_str()));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}